

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_templates.h
# Opt level: O0

void __thiscall UniqueList<GLHorizonInfo>::Clear(UniqueList<GLHorizonInfo> *this)

{
  uint uVar1;
  GLHorizonInfo **ppGVar2;
  uint local_14;
  uint i;
  UniqueList<GLHorizonInfo> *this_local;
  
  local_14 = 0;
  while( true ) {
    uVar1 = TArray<GLHorizonInfo_*,_GLHorizonInfo_*>::Size(&this->Array);
    if (uVar1 <= local_14) break;
    ppGVar2 = TArray<GLHorizonInfo_*,_GLHorizonInfo_*>::operator[](&this->Array,(ulong)local_14);
    FreeList<GLHorizonInfo>::Release((FreeList<GLHorizonInfo> *)&this->field_0x10,*ppGVar2);
    local_14 = local_14 + 1;
  }
  TArray<GLHorizonInfo_*,_GLHorizonInfo_*>::Clear(&this->Array);
  return;
}

Assistant:

void Clear()
	{
		for(unsigned i=0;i<Array.Size();i++) TheFreeList.Release(Array[i]);
		Array.Clear();
	}